

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IResultCapture * Catch::getResultCapture(void)

{
  undefined **ppuVar1;
  IResultCapture *pIVar2;
  string local_50;
  ReusableStringStream local_30;
  SourceLineInfo local_18;
  
  if (IMutableContext::currentContext == (undefined8 *)0x0) {
    IMutableContext::currentContext = (undefined8 *)operator_new(0x30);
    ppuVar1 = &PTR__Context_001a0c50;
    *IMutableContext::currentContext = &PTR__Context_001a0c50;
    IMutableContext::currentContext[1] = &PTR__Context_001a0ca0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
  }
  else {
    ppuVar1 = (undefined **)*IMutableContext::currentContext;
  }
  pIVar2 = (IResultCapture *)(*(code *)ppuVar1[2])();
  if (pIVar2 != (IResultCapture *)0x0) {
    return pIVar2;
  }
  ReusableStringStream::ReusableStringStream(&local_30);
  local_18.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Cycling74[P]min-api/test/catch.hpp";
  local_18.line = 0x3354;
  operator<<(local_30.m_oss,&local_18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_30.m_oss,": Internal Catch2 error: ",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_30.m_oss,"No result capture instance",0x1a);
  std::__cxx11::stringbuf::str();
  throw_logic_error(&local_50);
}

Assistant:

inline IMutableContext& getCurrentMutableContext()
    {
        if( !IMutableContext::currentContext )
            IMutableContext::createContext();
        // NOLINTNEXTLINE(clang-analyzer-core.uninitialized.UndefReturn)
        return *IMutableContext::currentContext;
    }